

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

void Hex::Hexdumper<char>::output_asc(ostream *os,char *first,char *last)

{
  char cVar1;
  undefined8 in_RAX;
  uint8_t *p;
  undefined8 uStack_28;
  
  if (first < last) {
    uStack_28 = in_RAX;
    do {
      cVar1 = *first;
      if (0x5e < (byte)(cVar1 - 0x20U)) {
        cVar1 = '.';
      }
      uStack_28 = CONCAT17(cVar1,(undefined7)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_28 + 7),1);
      first = first + 1;
    } while (first != last);
  }
  return;
}

Assistant:

static void output_asc(std::ostream& os, const T*first, const T*last)
    {
        const uint8_t* p = (const uint8_t*)first;
        while (p < (const uint8_t*)last)
        {
            char c = *p;
            os << (isprintable(c) ? c : '.');

            ++p;
        }
    }